

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

void __thiscall
llvm::SmallVectorTemplateBase<llvm::DWARFGdbIndex::CompUnitEntry,_true>::push_back
          (SmallVectorTemplateBase<llvm::DWARFGdbIndex::CompUnitEntry,_true> *this,
          CompUnitEntry *Elt)

{
  uint64_t *puVar1;
  uint64_t uVar2;
  uint uVar3;
  
  uVar3 = (this->super_SmallVectorTemplateCommon<llvm::DWARFGdbIndex::CompUnitEntry,_void>).
          super_SmallVectorBase.Size;
  if ((this->super_SmallVectorTemplateCommon<llvm::DWARFGdbIndex::CompUnitEntry,_void>).
      super_SmallVectorBase.Capacity <= uVar3) {
    SmallVectorBase::grow_pod((SmallVectorBase *)this,this + 1,0,0x10);
    uVar3 = (this->super_SmallVectorTemplateCommon<llvm::DWARFGdbIndex::CompUnitEntry,_void>).
            super_SmallVectorBase.Size;
  }
  uVar2 = Elt->Length;
  puVar1 = (uint64_t *)
           ((long)(this->super_SmallVectorTemplateCommon<llvm::DWARFGdbIndex::CompUnitEntry,_void>).
                  super_SmallVectorBase.BeginX + (ulong)uVar3 * 0x10);
  *puVar1 = Elt->Offset;
  puVar1[1] = uVar2;
  uVar3 = (this->super_SmallVectorTemplateCommon<llvm::DWARFGdbIndex::CompUnitEntry,_void>).
          super_SmallVectorBase.Size;
  if (uVar3 < (this->super_SmallVectorTemplateCommon<llvm::DWARFGdbIndex::CompUnitEntry,_void>).
              super_SmallVectorBase.Capacity) {
    (this->super_SmallVectorTemplateCommon<llvm::DWARFGdbIndex::CompUnitEntry,_void>).
    super_SmallVectorBase.Size = uVar3 + 1;
    return;
  }
  __assert_fail("N <= capacity()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/SmallVector.h"
                ,0x43,"void llvm::SmallVectorBase::set_size(size_t)");
}

Assistant:

void push_back(const T &Elt) {
    if (LLVM_UNLIKELY(this->size() >= this->capacity()))
      this->grow();
    memcpy(reinterpret_cast<void *>(this->end()), &Elt, sizeof(T));
    this->set_size(this->size() + 1);
  }